

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O3

Point * MeshLib::Trait::getUV(Point *__return_storage_ptr__,string *s)

{
  double py;
  string subs;
  char line [1024];
  double local_440;
  undefined1 *local_438 [2];
  undefined1 local_428 [16];
  undefined1 local_418 [1024];
  
  std::__cxx11::string::find((char *)s,0x114819,0);
  std::__cxx11::string::substr((ulong)local_438,(ulong)s);
  __isoc99_sscanf(local_438[0],"uv=(%lf %lf)%s",__return_storage_ptr__,&local_440,local_418);
  __return_storage_ptr__->v[1] = local_440;
  __return_storage_ptr__->v[2] = 0.0;
  if (local_438[0] != local_428) {
    operator_delete(local_438[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

Point Trait::getUV(std::string s)
{
	std::string::size_type pos = s.find ("uv=");
	std::string subs = s.substr (pos);
	double px, py;
	char line[1024];
	sscanf(subs.c_str (),"uv=(%lf %lf)%s",&px,&py,line);
	return Point(px,py,0);
}